

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerAdapter.cxx
# Opt level: O2

void __thiscall cmDebugger::SyncEvent::Wait(SyncEvent *this)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,&this->Mutex);
  std::condition_variable::wait<cmDebugger::SyncEvent::Wait()::_lambda()_1_>
            (&this->Cv,&local_20,(anon_class_8_1_8991fb9c)this);
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void Wait()
  {
    std::unique_lock<std::mutex> lock(Mutex);
    Cv.wait(lock, [&] { return Fired; });
  }